

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

void __thiscall pybind11::arg_v::arg_v<Bool_const&>(arg_v *this,arg *base,Bool *x,char *descr)

{
  undefined8 uVar1;
  handle hVar2;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar3;
  
  uVar1 = *(undefined8 *)&base->field_0x8;
  (this->super_arg).name = base->name;
  *(undefined8 *)&(this->super_arg).field_0x8 = uVar1;
  pVar3 = detail::type_caster_generic::src_and_type(x,(type_info *)&Bool::typeinfo,(type_info *)0x0)
  ;
  hVar2 = detail::type_caster_generic::cast
                    (pVar3.first,copy,(handle)0x0,pVar3.second,
                     anon_func::anon_class_1_0_00000001::__invoke,
                     anon_func::anon_class_1_0_00000001::__invoke,(void *)0x0);
  (this->value).super_handle.m_ptr = hVar2.m_ptr;
  this->descr = descr;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  *(undefined4 *)&(this->type).field_2 = 0x6f6f4234;
  *(undefined2 *)((long)&(this->type).field_2 + 4) = 0x6c;
  (this->type)._M_string_length = 5;
  detail::clean_type_id(&this->type);
  return;
}

Assistant:

arg_v(arg &&base, T &&x, const char *descr = nullptr)
        : arg(base),
          value(reinterpret_steal<object>(
              detail::make_caster<T>::cast(x, return_value_policy::automatic, {})
          )),
          descr(descr)
#if !defined(NDEBUG)
        , type(type_id<T>())
#endif
    { }